

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopFont(void)

{
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  
  pIVar1 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  ImVector<ImFont_*>::pop_back(&pIVar1->FontStack);
  if ((pIVar1->FontStack).Size == 0) {
    ppIVar2 = ImVector<ImFont_*>::operator[](&((pIVar1->IO).Fonts)->Fonts,0);
  }
  else {
    ppIVar2 = ImVector<ImFont_*>::back(&pIVar1->FontStack);
  }
  SetCurrentFont(*ppIVar2);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? g.IO.Fonts->Fonts[0] : g.FontStack.back());
}